

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O2

string * __thiscall
kws::Parser::ExtractLine_abi_cxx11_(string *__return_storage_ptr__,Parser *this,size_t pos)

{
  ulong uVar1;
  allocator local_19;
  
  uVar1 = std::__cxx11::string::find((char *)&this->m_Buffer,0x1554d2);
  if (pos < uVar1) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->m_Buffer);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::ExtractLine(size_t pos)
{
  size_t p = m_Buffer.find("\n",pos);
  if(p>pos)
    {
    return m_Buffer.substr(pos,p-pos-1);
    }
  return "";
}